

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FieldDescriptor * __thiscall
google::protobuf::FileDescriptor::FindExtensionByName(FileDescriptor *this,string *key)

{
  bool bVar1;
  Symbol SVar2;
  undefined1 local_30 [8];
  Symbol result;
  string *key_local;
  FileDescriptor *this_local;
  
  result.field_1 = (anon_union_8_8_13f84498_for_Symbol_2)key;
  SVar2 = FileDescriptorTables::FindNestedSymbolOfType
                    (*(FileDescriptorTables **)(this + 0xa8),this,key,FIELD);
  result._0_8_ = SVar2.field_1;
  local_30._0_4_ = SVar2.type;
  bVar1 = Symbol::IsNull((Symbol *)local_30);
  if ((bVar1) || (bVar1 = FieldDescriptor::is_extension((FieldDescriptor *)result._0_8_), !bVar1)) {
    this_local = (FileDescriptor *)0x0;
  }
  else {
    this_local = (FileDescriptor *)result._0_8_;
  }
  return (FieldDescriptor *)this_local;
}

Assistant:

const FieldDescriptor*
FileDescriptor::FindExtensionByName(const string& key) const {
  Symbol result = tables_->FindNestedSymbolOfType(this, key, Symbol::FIELD);
  if (!result.IsNull() && result.field_descriptor->is_extension()) {
    return result.field_descriptor;
  } else {
    return NULL;
  }
}